

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O0

void __thiscall AllRgbWidget::paintEvent(AllRgbWidget *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  ImageConversionFlags local_e8;
  QRect local_e4;
  QRect local_d4;
  QFlags<Qt::ImageConversionFlag> local_c4;
  QRect local_c0;
  QRectF local_b0;
  QRect local_90;
  QRect local_80;
  QRectF local_70;
  QRectF local_50;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  AllRgbWidget *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QPainter::save();
  PanAndZoomWidget::TransformPainter(&this->super_PanAndZoomWidget,local_20);
  local_80 = (QRect)QImage::rect();
  QRectF::QRectF(&local_70,&local_80);
  local_90 = (QRect)QImage::rect();
  iVar1 = QRect::width(&local_90);
  iVar2 = QImage::height();
  QRectF::translated(&local_50,&local_70,(double)-(iVar1 / 2),(double)-(iVar2 / 2));
  local_c0 = (QRect)QImage::rect();
  QRectF::QRectF(&local_b0,&local_c0);
  QFlags<Qt::ImageConversionFlag>::QFlags(&local_c4,AutoColor);
  QPainter::drawImage((QRectF *)local_20,(QImage *)&local_50,(QRectF *)&this->allRgb_,
                      (QFlags_conflict1 *)&local_b0);
  QPainter::restore();
  local_d4 = (QRect)QImage::rect();
  local_e4 = (QRect)QImage::rect();
  QFlags<Qt::ImageConversionFlag>::QFlags(&local_e8,AutoColor);
  QPainter::drawImage(local_20,&local_d4,&this->targetThumbnail_,&local_e4,local_e8);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void AllRgbWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);

    p.save();
    // centre the image around the origin
    TransformPainter(p);
    p.drawImage(QRectF(allRgb_.rect()).translated(allRgb_.rect().width() / -2, allRgb_.height() / -2), allRgb_, QRectF(allRgb_.rect()));
    p.restore();

    // draw thumbnail of target
    p.drawImage(targetThumbnail_.rect(), targetThumbnail_, targetThumbnail_.rect());
}